

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O3

bool __thiscall
deqp::egl::Image::GLES2ImageApi::Create::invokeGLES2
          (Create *this,GLES2ImageApi *api,
          MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *image,Texture2D *ref)

{
  ImageSource *pIVar1;
  UniqueImage *pUVar2;
  UniqueImage *pUVar3;
  UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> local_30;
  
  pIVar1 = (this->m_imgSource).
           super_UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
           .m_data.ptr;
  (*pIVar1->_vptr_ImageSource[3])(&local_30,pIVar1,api->m_gl);
  pUVar2 = local_30.m_data.ptr;
  createImage((MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *)&local_30,api,
              (this->m_imgSource).
              super_UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
              .m_data.ptr,(ClientBuffer *)local_30.m_data.ptr);
  pUVar3 = local_30.m_data.ptr;
  local_30.m_data.ptr = (UniqueImage *)0x0;
  if ((image->super_UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>).m_data.
      ptr != pUVar3) {
    de::details::UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>::reset
              (&image->super_UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>);
    (image->super_UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>).m_data.ptr
         = pUVar3;
  }
  de::details::UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>::reset
            (&local_30);
  (*(code *)pUVar2->m_egl[1]._vptr_Library)(pUVar2);
  return true;
}

Assistant:

bool GLES2ImageApi::Create::invokeGLES2 (GLES2ImageApi& api, MovePtr<UniqueImage>& image, tcu::Texture2D& ref) const
{
	de::UniquePtr<ClientBuffer>	buffer	(m_imgSource->createBuffer(api.m_gl, &ref));
	image = api.createImage(*m_imgSource, *buffer);
	return true;
}